

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomGradientStop::write(DomGradientStop *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QAnyStringView *size;
  long in_FS_OFFSET;
  double dVar2;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffee8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffef0;
  DomColor *this_00;
  QString *in_stack_fffffffffffffef8;
  QAnyStringView *in_stack_ffffffffffffff00;
  undefined1 local_b0 [24];
  undefined1 local_98 [24];
  size_t local_80;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  size = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1b3359);
  if (bVar1) {
    __n = 0xc;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"gradientstop",0xc);
    QString::QString((QString *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffee8);
  }
  QAnyStringView::QAnyStringView(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)size);
  QString::~QString((QString *)0x1b340c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffef0);
  }
  bVar1 = hasAttributePosition(this);
  if (bVar1) {
    in_stack_ffffffffffffff00 = size;
    Qt::Literals::StringLiterals::operator____s((char16_t *)this,(size_t)size);
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar2 = attributePosition(this);
    QString::number(dVar2,(char)local_98,0x66);
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_ffffffffffffff00,local_58);
    QString::~QString((QString *)0x1b34da);
    QString::~QString((QString *)0x1b34e7);
    __n = local_80;
  }
  if ((this->m_children & 1) != 0) {
    this_00 = this->m_color;
    Qt::Literals::StringLiterals::operator____s((char16_t *)this,(size_t)in_stack_ffffffffffffff00);
    DomColor::write(this_00,(int)size,local_b0,__n);
    QString::~QString((QString *)0x1b3543);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomGradientStop::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("gradientstop") : tagName.toLower());

    if (hasAttributePosition())
        writer.writeAttribute(u"position"_s, QString::number(attributePosition(), 'f', 15));

    if (m_children & Color)
        m_color->write(writer, u"color"_s);

    writer.writeEndElement();
}